

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

_Bool mpack_tree_reserve_bytes(mpack_tree_parser_t *parser,size_t bytes)

{
  ulong uVar1;
  _Bool _Var2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  mpack_error_t error;
  mpack_tree_t *tree;
  ulong __size;
  
  sVar3 = parser->possible_nodes_left - bytes;
  if (parser->possible_nodes_left < bytes) {
    tree = parser->tree;
    sVar7 = tree->data_length;
    __size = tree->max_size;
    uVar5 = sVar7 + bytes;
    if (__size < uVar5) {
      error = mpack_error_too_big;
    }
    else {
      if (tree->read_fn != (mpack_tree_read_t)0x0) {
        uVar6 = tree->buffer_capacity;
        if (uVar6 < uVar5) {
          uVar1 = 0x1000;
          if (uVar6 != 0) {
            uVar1 = uVar6;
          }
          do {
            uVar6 = uVar1;
            uVar1 = uVar6 * 2;
          } while (uVar6 < uVar5);
          if (uVar6 < __size) {
            __size = uVar6;
          }
          if (tree->buffer == (char *)0x0) {
            pcVar4 = (char *)malloc(__size);
          }
          else {
            pcVar4 = (char *)realloc(tree->buffer,__size);
          }
          if (pcVar4 == (char *)0x0) {
            tree = parser->tree;
            error = mpack_error_memory;
            goto LAB_00107757;
          }
          tree->data = pcVar4;
          tree->buffer = pcVar4;
          tree->buffer_capacity = __size;
          sVar7 = tree->data_length;
        }
        do {
          sVar3 = (*tree->read_fn)(tree,tree->buffer + sVar7,tree->buffer_capacity - sVar7);
          if (tree->error != mpack_ok) goto LAB_0010775c;
          if (sVar3 + 1 < 2) {
            tree = parser->tree;
            error = mpack_error_io;
            goto LAB_00107757;
          }
          sVar7 = tree->data_length + sVar3;
          tree->data_length = sVar7;
          uVar5 = sVar3 + parser->possible_nodes_left;
          parser->possible_nodes_left = uVar5;
          sVar3 = uVar5 - bytes;
        } while (uVar5 < bytes);
        goto LAB_001077bb;
      }
      error = mpack_error_invalid;
    }
LAB_00107757:
    mpack_tree_flag_error(tree,error);
LAB_0010775c:
    _Var2 = false;
  }
  else {
LAB_001077bb:
    parser->possible_nodes_left = sVar3;
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

MPACK_STATIC_INLINE bool mpack_tree_reserve_bytes(mpack_tree_parser_t* parser, size_t bytes) {
    if (bytes <= parser->possible_nodes_left) {
        parser->possible_nodes_left -= bytes;
        return true;
    }

    #ifdef MPACK_MALLOC
    return mpack_tree_reserve_fill(parser, bytes);
    #else
    mpack_tree_flag_error(parser->tree, mpack_error_invalid);
    return false;
    #endif
}